

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall spoa::Graph::Clear(Graph *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer ppNVar3;
  
  this->num_codes_ = 0;
  piVar1 = (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0xff,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
  }
  piVar1 = (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar2) {
    memset(piVar1,0xff,((long)piVar2 + (-4 - (long)piVar1) & 0xfffffffffffffffcU) + 4);
  }
  ppNVar3 = (this->sequences_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sequences_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    (this->sequences_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
  }
  std::
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  ::_M_erase_at_end(&this->nodes_,
                    (this->nodes_).
                    super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ::_M_erase_at_end(&this->edges_,
                    (this->edges_).
                    super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  ppNVar3 = (this->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->rank_to_node_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    (this->rank_to_node_).
    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar3;
  }
  ppNVar3 = (this->consensus_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->consensus_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar3) {
    (this->consensus_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppNVar3;
  }
  return;
}

Assistant:

void Graph::Clear() {
  num_codes_ = 0;
  std::fill(coder_.begin(), coder_.end(), -1);
  std::fill(decoder_.begin(), decoder_.end(), -1);
  sequences_.clear();
  nodes_.clear();
  edges_.clear();
  rank_to_node_.clear();
  consensus_.clear();
}